

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O0

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>::
set_result(cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>
           *this,shared_ptr<nuraft::resp_msg> *result,shared_ptr<nuraft::rpc_exception> *err,
          cmd_result_code code)

{
  bool bVar1;
  undefined4 in_ECX;
  shared_ptr<nuraft::resp_msg> *in_RDI;
  lock_guard<std::mutex> guard;
  bool call_handler;
  mutex_type *in_stack_ffffffffffffffc8;
  cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>
  *in_stack_ffffffffffffffd8;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar2;
  
  uVar2 = (uint)in_stack_ffffffffffffffe0;
  *(undefined4 *)&in_RDI[3].super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_ECX;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffc8);
  std::shared_ptr<nuraft::resp_msg>::operator=
            (in_RDI,(shared_ptr<nuraft::resp_msg> *)in_stack_ffffffffffffffc8);
  std::shared_ptr<nuraft::rpc_exception>::operator=
            ((shared_ptr<nuraft::rpc_exception> *)in_RDI,
             (shared_ptr<nuraft::rpc_exception> *)in_stack_ffffffffffffffc8);
  *(undefined1 *)
   ((long)&in_RDI[3].super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       1;
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                      *)0x3215d3);
  if ((bVar1) ||
     (bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                          *)0x3215e5), bVar1)) {
    uVar2 = CONCAT13(1,(int3)uVar2);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x3215fa);
  if ((uVar2 & 0x1000000) != 0) {
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                        *)0x32160f);
    if (bVar1) {
      std::
      function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
      ::operator()((function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                    *)CONCAT44(in_ECX,uVar2),in_stack_ffffffffffffffd8,
                   (shared_ptr<nuraft::rpc_exception> *)in_RDI);
    }
    else {
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                          *)0x32163b);
      if (bVar1) {
        std::
        function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
        ::operator()((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                      *)CONCAT44(in_ECX,uVar2),&in_stack_ffffffffffffffd8->empty_result_,
                     (shared_ptr<nuraft::rpc_exception> *)in_RDI);
      }
    }
  }
  std::condition_variable::notify_all();
  return;
}

Assistant:

void set_result(T& result, TE& err, cmd_result_code code = cmd_result_code::OK) {
        bool call_handler = false;
        code_ = code;
        {   std::lock_guard<std::mutex> guard(lock_);
            result_ = result;
            err_ = err;
            has_result_ = true;
            if (handler_ || handler2_) call_handler = true;
        }
        if (call_handler) {
            if (handler2_) handler2_(*this, err);
            else if (handler_) handler_(result, err);
        }
        cv_.notify_all();
    }